

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void ReconstructRow(VP8Decoder *dec,VP8ThreadContext *ctx)

{
  int mb_y_00;
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined4 *__s;
  int *in_RSI;
  long in_RDI;
  uint8_t *v_out;
  uint8_t *u_out;
  uint8_t *y_out;
  int uv_offset;
  int y_offset;
  int pred_func_1;
  uint32_t bits_uv;
  int pred_func;
  uint8_t *dst;
  uint32_t *top_right;
  int n;
  uint32_t bits;
  int16_t *coeffs;
  VP8TopSamples *top_yuv;
  VP8MBData *block;
  uint8_t *v_dst;
  uint8_t *u_dst;
  uint8_t *y_dst;
  int cache_id;
  int mb_y;
  int mb_x;
  int j;
  int16_t *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  uint32_t bits_00;
  int16_t *in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff84;
  int local_58;
  int local_18;
  int local_14;
  
  mb_y_00 = in_RSI[1];
  iVar1 = *in_RSI;
  lVar3 = *(long *)(in_RDI + 0xb20);
  puVar8 = (uint8_t *)(lVar3 + 0x28);
  lVar4 = *(long *)(in_RDI + 0xb20);
  puVar9 = (uint8_t *)(lVar4 + 0x248);
  lVar5 = *(long *)(in_RDI + 0xb20);
  puVar10 = (uint8_t *)(lVar5 + 600);
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    puVar8[local_14 * 0x20 + -1] = 0x81;
  }
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    puVar9[local_14 * 0x20 + -1] = 0x81;
    puVar10[local_14 * 0x20 + -1] = 0x81;
  }
  if (mb_y_00 < 1) {
    memset((void *)(lVar3 + 7),0x7f,0x15);
    memset((void *)(lVar4 + 0x227),0x7f,9);
    memset((void *)(lVar5 + 0x237),0x7f,9);
  }
  else {
    *(undefined1 *)(lVar5 + 0x237) = 0x81;
    *(undefined1 *)(lVar4 + 0x227) = 0x81;
    *(undefined1 *)(lVar3 + 7) = 0x81;
  }
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x198); local_18 = local_18 + 1) {
    lVar11 = *(long *)(in_RSI + 6) + (long)local_18 * 800;
    if (0 < local_18) {
      for (local_14 = -1; local_14 < 0x10; local_14 = local_14 + 1) {
        Copy32b(puVar8 + (local_14 * 0x20 + -4),puVar8 + (local_14 * 0x20 + 0xc));
      }
      for (local_14 = -1; local_14 < 8; local_14 = local_14 + 1) {
        Copy32b(puVar9 + (local_14 * 0x20 + -4),puVar9 + (local_14 * 0x20 + 4));
        Copy32b(puVar10 + (local_14 * 0x20 + -4),puVar10 + (local_14 * 0x20 + 4));
      }
    }
    puVar12 = (undefined8 *)(*(long *)(in_RDI + 0xb08) + (long)local_18 * 0x20);
    iVar7 = *(int *)(lVar11 + 0x314);
    if (0 < mb_y_00) {
      *(undefined8 *)(lVar3 + 8) = *puVar12;
      *(undefined8 *)(lVar3 + 0x10) = puVar12[1];
      *(undefined8 *)(lVar4 + 0x228) = puVar12[2];
      *(undefined8 *)(lVar5 + 0x238) = puVar12[3];
    }
    if (*(char *)(lVar11 + 0x300) == '\0') {
      iVar6 = CheckMode(local_18,mb_y_00,(uint)*(byte *)(lVar11 + 0x301));
      (*VP8PredLuma16[iVar6])(puVar8);
      if (iVar7 != 0) {
        for (local_58 = 0; local_58 < 0x10; local_58 = local_58 + 1) {
          DoTransform(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
          ;
        }
      }
    }
    else {
      __s = (undefined4 *)(lVar3 + 0x18);
      if (0 < mb_y_00) {
        if (local_18 < *(int *)(in_RDI + 0x198) + -1) {
          *__s = *(undefined4 *)(puVar12 + 4);
        }
        else {
          memset(__s,(uint)*(byte *)((long)puVar12 + 0xf),4);
        }
      }
      uVar2 = *__s;
      *(undefined4 *)(lVar3 + 0x198) = uVar2;
      *(undefined4 *)(lVar3 + 0x118) = uVar2;
      *(undefined4 *)(lVar3 + 0x98) = uVar2;
      for (local_58 = 0; local_58 < 0x10; local_58 = local_58 + 1) {
        (*VP8PredLuma4[*(byte *)(lVar11 + 0x301 + (long)local_58)])
                  (puVar8 + (int)(uint)kScan[local_58]);
        DoTransform(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
    }
    bits_00 = (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    iVar7 = CheckMode(local_18,mb_y_00,(uint)*(byte *)(lVar11 + 0x311));
    (*VP8PredChroma8[iVar7])(puVar9);
    (*VP8PredChroma8[iVar7])(puVar10);
    DoUVTransform(bits_00,in_stack_ffffffffffffff68,(uint8_t *)0x15b9da);
    DoUVTransform(bits_00,in_stack_ffffffffffffff68,(uint8_t *)0x15b9f7);
    if (mb_y_00 < *(int *)(in_RDI + 0x19c) + -1) {
      *puVar12 = *(undefined8 *)(lVar3 + 0x208);
      puVar12[1] = *(undefined8 *)(lVar3 + 0x210);
      puVar12[2] = *(undefined8 *)(lVar4 + 0x328);
      puVar12[3] = *(undefined8 *)(lVar5 + 0x338);
    }
    in_stack_ffffffffffffff84 = iVar1 * 8 * *(int *)(in_RDI + 0xb44);
    in_stack_ffffffffffffff78 =
         (int16_t *)
         (*(long *)(in_RDI + 0xb28) + (long)(local_18 << 4) +
         (long)(iVar1 * 0x10 * *(int *)(in_RDI + 0xb40)));
    in_stack_ffffffffffffff70 =
         (uint8_t *)
         (*(long *)(in_RDI + 0xb30) + (long)(local_18 << 3) + (long)(int)in_stack_ffffffffffffff84);
    in_stack_ffffffffffffff68 =
         (int16_t *)
         (*(long *)(in_RDI + 0xb38) + (long)(local_18 << 3) + (long)(int)in_stack_ffffffffffffff84);
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      lVar11 = (long)(local_14 * *(int *)(in_RDI + 0xb40));
      *(undefined8 *)((long)in_stack_ffffffffffffff78 + lVar11) =
           *(undefined8 *)(puVar8 + (local_14 << 5));
      *(undefined8 *)((long)in_stack_ffffffffffffff78 + lVar11 + 8) =
           *(undefined8 *)(lVar3 + 0x30 + (long)(local_14 << 5));
    }
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      *(undefined8 *)(in_stack_ffffffffffffff70 + local_14 * *(int *)(in_RDI + 0xb44)) =
           *(undefined8 *)(puVar9 + (local_14 << 5));
      *(undefined8 *)((long)in_stack_ffffffffffffff68 + (long)(local_14 * *(int *)(in_RDI + 0xb44)))
           = *(undefined8 *)(puVar10 + (local_14 << 5));
    }
  }
  return;
}

Assistant:

static void ReconstructRow(const VP8Decoder* const dec,
                           const VP8ThreadContext* ctx) {
  int j;
  int mb_x;
  const int mb_y = ctx->mb_y_;
  const int cache_id = ctx->id_;
  uint8_t* const y_dst = dec->yuv_b_ + Y_OFF;
  uint8_t* const u_dst = dec->yuv_b_ + U_OFF;
  uint8_t* const v_dst = dec->yuv_b_ + V_OFF;

  // Initialize left-most block.
  for (j = 0; j < 16; ++j) {
    y_dst[j * BPS - 1] = 129;
  }
  for (j = 0; j < 8; ++j) {
    u_dst[j * BPS - 1] = 129;
    v_dst[j * BPS - 1] = 129;
  }

  // Init top-left sample on left column too.
  if (mb_y > 0) {
    y_dst[-1 - BPS] = u_dst[-1 - BPS] = v_dst[-1 - BPS] = 129;
  } else {
    // we only need to do this init once at block (0,0).
    // Afterward, it remains valid for the whole topmost row.
    memset(y_dst - BPS - 1, 127, 16 + 4 + 1);
    memset(u_dst - BPS - 1, 127, 8 + 1);
    memset(v_dst - BPS - 1, 127, 8 + 1);
  }

  // Reconstruct one row.
  for (mb_x = 0; mb_x < dec->mb_w_; ++mb_x) {
    const VP8MBData* const block = ctx->mb_data_ + mb_x;

    // Rotate in the left samples from previously decoded block. We move four
    // pixels at a time for alignment reason, and because of in-loop filter.
    if (mb_x > 0) {
      for (j = -1; j < 16; ++j) {
        Copy32b(&y_dst[j * BPS - 4], &y_dst[j * BPS + 12]);
      }
      for (j = -1; j < 8; ++j) {
        Copy32b(&u_dst[j * BPS - 4], &u_dst[j * BPS + 4]);
        Copy32b(&v_dst[j * BPS - 4], &v_dst[j * BPS + 4]);
      }
    }
    {
      // bring top samples into the cache
      VP8TopSamples* const top_yuv = dec->yuv_t_ + mb_x;
      const int16_t* const coeffs = block->coeffs_;
      uint32_t bits = block->non_zero_y_;
      int n;

      if (mb_y > 0) {
        memcpy(y_dst - BPS, top_yuv[0].y, 16);
        memcpy(u_dst - BPS, top_yuv[0].u, 8);
        memcpy(v_dst - BPS, top_yuv[0].v, 8);
      }

      // predict and add residuals
      if (block->is_i4x4_) {   // 4x4
        uint32_t* const top_right = (uint32_t*)(y_dst - BPS + 16);

        if (mb_y > 0) {
          if (mb_x >= dec->mb_w_ - 1) {    // on rightmost border
            memset(top_right, top_yuv[0].y[15], sizeof(*top_right));
          } else {
            memcpy(top_right, top_yuv[1].y, sizeof(*top_right));
          }
        }
        // replicate the top-right pixels below
        top_right[BPS] = top_right[2 * BPS] = top_right[3 * BPS] = top_right[0];

        // predict and add residuals for all 4x4 blocks in turn.
        for (n = 0; n < 16; ++n, bits <<= 2) {
          uint8_t* const dst = y_dst + kScan[n];
          VP8PredLuma4[block->imodes_[n]](dst);
          DoTransform(bits, coeffs + n * 16, dst);
        }
      } else {    // 16x16
        const int pred_func = CheckMode(mb_x, mb_y, block->imodes_[0]);
        VP8PredLuma16[pred_func](y_dst);
        if (bits != 0) {
          for (n = 0; n < 16; ++n, bits <<= 2) {
            DoTransform(bits, coeffs + n * 16, y_dst + kScan[n]);
          }
        }
      }
      {
        // Chroma
        const uint32_t bits_uv = block->non_zero_uv_;
        const int pred_func = CheckMode(mb_x, mb_y, block->uvmode_);
        VP8PredChroma8[pred_func](u_dst);
        VP8PredChroma8[pred_func](v_dst);
        DoUVTransform(bits_uv >> 0, coeffs + 16 * 16, u_dst);
        DoUVTransform(bits_uv >> 8, coeffs + 20 * 16, v_dst);
      }

      // stash away top samples for next block
      if (mb_y < dec->mb_h_ - 1) {
        memcpy(top_yuv[0].y, y_dst + 15 * BPS, 16);
        memcpy(top_yuv[0].u, u_dst +  7 * BPS,  8);
        memcpy(top_yuv[0].v, v_dst +  7 * BPS,  8);
      }
    }
    // Transfer reconstructed samples from yuv_b_ cache to final destination.
    {
      const int y_offset = cache_id * 16 * dec->cache_y_stride_;
      const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
      uint8_t* const y_out = dec->cache_y_ + mb_x * 16 + y_offset;
      uint8_t* const u_out = dec->cache_u_ + mb_x * 8 + uv_offset;
      uint8_t* const v_out = dec->cache_v_ + mb_x * 8 + uv_offset;
      for (j = 0; j < 16; ++j) {
        memcpy(y_out + j * dec->cache_y_stride_, y_dst + j * BPS, 16);
      }
      for (j = 0; j < 8; ++j) {
        memcpy(u_out + j * dec->cache_uv_stride_, u_dst + j * BPS, 8);
        memcpy(v_out + j * dec->cache_uv_stride_, v_dst + j * BPS, 8);
      }
    }
  }
}